

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

_Bool arm_is_secure_below_el3(CPUARMState_conflict *env)

{
  int iVar1;
  CPUARMState_conflict *env_local;
  
  iVar1 = arm_feature(env,0x21);
  if (iVar1 == 0) {
    env_local._7_1_ = false;
  }
  else {
    env_local._7_1_ = ((env->cp15).scr_el3 & 1) == 0;
  }
  return env_local._7_1_;
}

Assistant:

static inline bool arm_is_secure_below_el3(CPUARMState *env)
{
    if (arm_feature(env, ARM_FEATURE_EL3)) {
        return !(env->cp15.scr_el3 & SCR_NS);
    } else {
        /* If EL3 is not supported then the secure state is implementation
         * defined, in which case QEMU defaults to non-secure.
         */
        return false;
    }
}